

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O0

void __thiscall ON_XMLNode::RemoveAllProperties(ON_XMLNode *this)

{
  lock_guard<std::recursive_mutex> local_18;
  lock_guard<std::recursive_mutex> lg;
  ON_XMLNode *this_local;
  
  lg._M_device = (mutex_type *)this;
  std::lock_guard<std::recursive_mutex>::lock_guard(&local_18,&this->_private->m_mutex);
  ON_XMLNodePrivate::RemoveAllProperties(this->_private);
  ON_XMLNodePrivate::AddEmptyDefaultProperty(this->_private);
  std::lock_guard<std::recursive_mutex>::~lock_guard(&local_18);
  return;
}

Assistant:

void ON_XMLNode::RemoveAllProperties(void)
{
  std::lock_guard<std::recursive_mutex> lg(_private->m_mutex);

  _private->RemoveAllProperties();
  _private->AddEmptyDefaultProperty();
}